

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O1

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  long lVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  DiyFp DVar5;
  DiyFp w_p;
  DiyFp w_m;
  DiyFp local_90;
  DiyFp local_80;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  local_90.f = (ulong)value & 0xfffffffffffff;
  if (((ulong)value >> 0x34 & 0x7ff) == 0) {
    local_90.e = -0x432;
  }
  else {
    local_90.f = local_90.f + 0x10000000000000;
    local_90.e = ((uint)((ulong)value >> 0x34) & 0x7ff) - 0x433;
  }
  DiyFp::NormalizedBoundaries(&local_90,&local_40,&local_50);
  dVar2 = (double)(-0x3d - local_50.e) * 0.30102999566398114 + 347.0;
  iVar3 = (int)((uint)((double)(int)dVar2 < dVar2) + (int)dVar2) >> 3;
  uVar4 = (ulong)(iVar3 + 1);
  *K = 0x15c - (iVar3 * 8 + 8);
  local_60.f = *(uint64_t *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_F + uVar4 * 8);
  local_60.e = (int)*(short *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_E + uVar4 * 2);
  uVar4 = 0x3f;
  if (local_90.f != 0) {
    for (; local_90.f >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  local_80.f = local_90.f << ((byte)(uVar4 ^ 0x3f) & 0x3f);
  local_80.e = local_90.e - (int)(uVar4 ^ 0x3f);
  DVar5 = DiyFp::operator*(&local_80,&local_60);
  local_70.f = DVar5.f;
  local_70.e = DVar5.e;
  DVar5 = DiyFp::operator*(&local_50,&local_60);
  local_80.f = DVar5.f;
  local_80.e = DVar5.e;
  DVar5 = DiyFp::operator*(&local_40,&local_60);
  lVar1 = local_80.f - 1;
  local_80.f = local_80.f - 1;
  DigitGen(&local_70,&local_80,lVar1 + ~DVar5.f,buffer,length,K);
  return;
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}